

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status hrgls_MessageSetValue(hrgls_Message obj,char *val)

{
  hrgls_Status s;
  char *val_local;
  hrgls_Message obj_local;
  
  if (obj == (hrgls_Message)0x0) {
    obj_local._4_4_ = 0x3ee;
  }
  else if (val == (char *)0x0) {
    obj_local._4_4_ = 0x3e9;
  }
  else {
    std::__cxx11::string::operator=((string *)obj,val);
    obj_local._4_4_ = 0;
  }
  return obj_local._4_4_;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_MessageSetValue(hrgls_Message obj, const char *val)
  {
	  hrgls_Status s = hrgls_STATUS_OKAY;
	  if (!obj) {
		  return hrgls_STATUS_NULL_OBJECT_POINTER;
	  }
	  if (!val) {
		  return hrgls_STATUS_BAD_PARAMETER;
	  }
	  obj->value = val;
	  return s;
  }